

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

XCKernel ExchCXX::libxc_kernel_factory(Kernel kern,Spin spin_polar)

{
  bool bVar1;
  undefined8 uVar2;
  XCKernelImpl *in_RDI;
  impl_ptr *ptr;
  undefined8 in_stack_ffffffffffffff50;
  unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
  *this;
  unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
  *in_stack_ffffffffffffff58;
  unique_ptr<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  *in_stack_ffffffffffffff60;
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> msg;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  _Head_base<0UL,_ExchCXX::detail::LibxcKernelImpl_*,_false> in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff97;
  
  msg._M_head_impl = in_RDI;
  bVar1 = libxc_supports_kernel((Kernel)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  if (!bVar1) {
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar3,in_stack_ffffffffffffff90)),
               (char *)in_stack_ffffffffffffff88._M_head_impl,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar3,in_stack_ffffffffffffff90)),
               (char *)in_stack_ffffffffffffff88._M_head_impl,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    exchcxx_exception::exchcxx_exception
              ((exchcxx_exception *)
               CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar3,in_stack_ffffffffffffff90)),
               (string *)in_stack_ffffffffffffff88._M_head_impl,in_stack_ffffffffffffff84,
               (string *)msg._M_head_impl);
    __cxa_throw(uVar2,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
  }
  ptr = (impl_ptr *)&stack0xffffffffffffff80;
  std::make_unique<ExchCXX::detail::LibxcKernelImpl,ExchCXX::Kernel_const&,ExchCXX::Spin_const&>
            ((Kernel *)msg._M_head_impl,(Spin *)in_RDI);
  this = (unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
          *)&stack0xffffffffffffff88;
  std::unique_ptr<ExchCXX::detail::XCKernelImpl,std::default_delete<ExchCXX::detail::XCKernelImpl>>
  ::
  unique_ptr<ExchCXX::detail::LibxcKernelImpl,std::default_delete<ExchCXX::detail::LibxcKernelImpl>,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  XCKernel::XCKernel((XCKernel *)this,ptr);
  std::
  unique_ptr<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>::
  ~unique_ptr((unique_ptr<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               *)this);
  std::
  unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
  ::~unique_ptr(this);
  return (impl_ptr)(impl_ptr)msg._M_head_impl;
}

Assistant:

XCKernel libxc_kernel_factory(const Kernel kern, 
  const Spin spin_polar ) {

  EXCHCXX_BOOL_CHECK( "KERNEL NYI FOR Libxc BACKEND", libxc_supports_kernel(kern) )

  return XCKernel( 
    std::make_unique< detail::LibxcKernelImpl >( kern, spin_polar ) );

}